

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O2

void Assimp::STEP::ReadFile
               (DB *db,ConversionSchema *scheme,char **types_to_track,size_t len,
               char **inverse_indices_to_track,size_t len2)

{
  ObjectMap *this;
  string *psVar1;
  StreamReaderLE *pSVar2;
  bool bVar3;
  ObjectMap *pOVar4;
  DB *this_00;
  bool bVar5;
  bool bVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  long lVar8;
  uint64_t uVar9;
  ulong uVar10;
  ulong uVar11;
  const_iterator cVar12;
  Logger *pLVar13;
  char *pcVar14;
  char *args;
  LazyObject *this_01;
  size_type sVar15;
  char cVar16;
  char cVar17;
  allocator<char> local_272;
  char local_271;
  LineSplitter *local_270;
  uint64_t local_268;
  uint64_t id;
  string local_258;
  ulong local_238;
  DB *local_230;
  string local_228;
  string s;
  string local_1c8;
  string type;
  
  db->schema = scheme;
  DB::SetTypesToTrack(db,types_to_track,len);
  DB::SetInverseIndicesToTrack(db,inverse_indices_to_track,len2);
  this = &db->objects;
  local_270 = &db->splitter;
  psVar1 = &(db->splitter).mCur;
  pOVar4 = &db->objects;
  local_230 = db;
  do {
    pSVar2 = (db->splitter).mStream;
    if (*(int *)&pSVar2->end == *(int *)&pSVar2->current) {
LAB_00598913:
      pSVar2 = (db->splitter).mStream;
      if (*(int *)&pSVar2->end == *(int *)&pSVar2->current) {
        pLVar13 = DefaultLogger::get();
        Logger::warn(pLVar13,"STEP: ignoring unexpected EOF");
      }
      bVar5 = DefaultLogger::isNullLogger();
      if (!bVar5) {
        pLVar13 = DefaultLogger::get();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&type);
        std::operator<<((ostream *)&type,"STEP: got ");
        std::ostream::_M_insert<unsigned_long>((ulong)&type);
        std::operator<<((ostream *)&type," object records with ");
        std::ostream::_M_insert<unsigned_long>((ulong)&type);
        std::operator<<((ostream *)&type," inverse index entries");
        std::__cxx11::stringbuf::str();
        Logger::debug(pLVar13,s._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&s);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&type);
      }
      return;
    }
    std::__cxx11::string::string((string *)&s,(string *)psVar1);
    bVar5 = std::operator==(&s,"ENDSEC;");
    if (bVar5) {
      std::__cxx11::string::~string((string *)&s);
      goto LAB_00598913;
    }
    type._M_dataplus._M_p._0_1_ = 0x20;
    _Var7 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )s._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(s._M_dataplus._M_p + s._M_string_length),
                       (_Iter_equals_val<const_char>)&type);
    std::__cxx11::string::erase(&s,_Var7._M_current,s._M_dataplus._M_p + s._M_string_length);
    if (s._M_string_length == 0) {
      __assert_fail("s.length()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/STEPParser/STEPFileReader.cpp"
                    ,0xc0,
                    "void Assimp::STEP::ReadFile(DB &, const EXPRESS::ConversionSchema &, const char *const *, size_t, const char *const *, size_t)"
                   );
    }
    local_268 = local_270->mIdx + 1;
    if (*s._M_dataplus._M_p == '#') {
      cVar16 = (char)&s;
      lVar8 = std::__cxx11::string::find(cVar16,0x3d);
      if (lVar8 == -1) {
        pLVar13 = DefaultLogger::get();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,"expected token \'=\'",(allocator<char> *)&local_1c8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"",(allocator<char> *)&id);
        AddLineNumber(&type,&local_258,local_268,&local_228);
        Logger::warn(pLVar13,(char *)CONCAT71(type._M_dataplus._M_p._1_7_,
                                              type._M_dataplus._M_p._0_1_));
        std::__cxx11::string::~string((string *)&type);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_258);
        LineSplitter::operator++(local_270);
      }
      else {
        std::__cxx11::string::substr((ulong)&type,(ulong)&s);
        uVar9 = strtoul10_64((char *)CONCAT71(type._M_dataplus._M_p._1_7_,
                                              type._M_dataplus._M_p._0_1_),(char **)0x0,(uint *)0x0)
        ;
        std::__cxx11::string::~string((string *)&type);
        id = uVar9;
        if (uVar9 == 0) {
          pLVar13 = DefaultLogger::get();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_258,"expected positive, numeric entity id",
                     (allocator<char> *)&local_1c8);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"",&local_272);
          AddLineNumber(&type,&local_258,local_268,&local_228);
          Logger::warn(pLVar13,(char *)CONCAT71(type._M_dataplus._M_p._1_7_,
                                                type._M_dataplus._M_p._0_1_));
          std::__cxx11::string::~string((string *)&type);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::string::~string((string *)&local_258);
          LineSplitter::operator++(local_270);
        }
        else {
          uVar10 = std::__cxx11::string::find(cVar16,0x28);
          local_271 = uVar10 == 0xffffffffffffffff;
          if ((bool)local_271) {
            LineSplitter::operator++(local_270);
            bVar5 = false;
            uVar10 = 0xffffffffffffffff;
            while (pSVar2 = (db->splitter).mStream, *(int *)&pSVar2->end != *(int *)&pSVar2->current
                  ) {
              std::__cxx11::string::string((string *)&type,(string *)psVar1);
              if (type._M_string_length == 0) {
                bVar3 = false;
              }
              else {
                bVar6 = anon_unknown.dwarf_1386c02::IsEntityDef(&type);
                bVar3 = true;
                if (!bVar6) {
                  std::__cxx11::string::append((string *)&s);
                  uVar10 = std::__cxx11::string::find(cVar16,0x28);
                  bVar5 = uVar10 != 0xffffffffffffffff;
                  bVar3 = false;
                }
              }
              std::__cxx11::string::~string((string *)&type);
              if (bVar3) break;
              LineSplitter::operator++(local_270);
            }
            if (bVar5) goto LAB_005984d2;
            pLVar13 = DefaultLogger::get();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_258,"expected token \'(\'",(allocator<char> *)&local_1c8);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"",&local_272);
            AddLineNumber(&type,&local_258,local_268,&local_228);
            Logger::warn(pLVar13,(char *)CONCAT71(type._M_dataplus._M_p._1_7_,
                                                  type._M_dataplus._M_p._0_1_));
LAB_005988e0:
            std::__cxx11::string::~string((string *)&type);
            std::__cxx11::string::~string((string *)&local_228);
            std::__cxx11::string::~string((string *)&local_258);
          }
          else {
LAB_005984d2:
            uVar11 = std::__cxx11::string::rfind(cVar16,0x29);
            local_238 = uVar10;
            if (((uVar11 < uVar10 || uVar11 == 0xffffffffffffffff) ||
                (uVar11 == s._M_string_length - 1)) || (s._M_dataplus._M_p[uVar11 + 1] != ';')) {
              LineSplitter::operator++(local_270);
              bVar5 = false;
              while (pSVar2 = (local_230->splitter).mStream,
                    *(int *)&pSVar2->end != *(int *)&pSVar2->current) {
                std::__cxx11::string::string((string *)&type,(string *)psVar1);
                if (type._M_string_length == 0) {
LAB_00598597:
                  bVar3 = false;
                }
                else {
                  bVar6 = anon_unknown.dwarf_1386c02::IsEntityDef(&type);
                  bVar3 = true;
                  if (!bVar6) {
                    std::__cxx11::string::append((string *)&s);
                    uVar11 = std::__cxx11::string::rfind(cVar16,0x29);
                    if (uVar11 < local_238 || uVar11 == 0xffffffffffffffff) {
                      bVar5 = false;
                      goto LAB_00598597;
                    }
                    if (uVar11 == s._M_string_length - 1) {
                      bVar5 = false;
                    }
                    else {
                      bVar5 = s._M_dataplus._M_p[uVar11 + 1] == ';';
                    }
                    bVar3 = false;
                  }
                }
                std::__cxx11::string::~string((string *)&type);
                if (bVar3) break;
                LineSplitter::operator++(local_270);
              }
              db = local_230;
              local_271 = '\x01';
              if (!bVar5) {
                pLVar13 = DefaultLogger::get();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,"expected token \')\'",(allocator<char> *)&local_1c8
                          );
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_228,"",&local_272);
                AddLineNumber(&type,&local_258,local_268,&local_228);
                Logger::warn(pLVar13,(char *)CONCAT71(type._M_dataplus._M_p._1_7_,
                                                      type._M_dataplus._M_p._0_1_));
                goto LAB_005988e0;
              }
            }
            cVar12 = std::
                     _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>_>
                     ::find(&this->_M_t,&id);
            if ((_Rb_tree_header *)cVar12._M_node != &(pOVar4->_M_t)._M_impl.super__Rb_tree_header)
            {
              pLVar13 = DefaultLogger::get();
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&type);
              std::operator<<((ostream *)&type,"an object with the id #");
              std::ostream::_M_insert<unsigned_long>((ulong)&type);
              std::operator<<((ostream *)&type," already exists");
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"",&local_272)
              ;
              AddLineNumber(&local_258,&local_228,local_268,&local_1c8);
              Logger::warn(pLVar13,local_258._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&local_258);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_228);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&type);
            }
            do {
              do {
                pcVar14 = (char *)std::__cxx11::string::at((ulong)&s);
              } while (*pcVar14 == '\t');
            } while (*pcVar14 == ' ');
            do {
              do {
                pcVar14 = (char *)std::__cxx11::string::at((ulong)&s);
              } while (*pcVar14 == ' ');
            } while (*pcVar14 == '\t');
            std::__cxx11::string::substr((ulong)&type,(ulong)&s);
            for (sVar15 = 0; type._M_string_length != sVar15; sVar15 = sVar15 + 1) {
              cVar16 = *(char *)(CONCAT71(type._M_dataplus._M_p._1_7_,type._M_dataplus._M_p._0_1_) +
                                sVar15);
              cVar17 = cVar16 + ' ';
              if (0x19 < (byte)(cVar16 + 0xbfU)) {
                cVar17 = cVar16;
              }
              *(char *)(CONCAT71(type._M_dataplus._M_p._1_7_,type._M_dataplus._M_p._0_1_) + sVar15)
                   = cVar17;
            }
            sVar15 = type._M_string_length;
            pcVar14 = EXPRESS::ConversionSchema::GetStaticStringForToken(scheme,&type);
            if (pcVar14 != (char *)0x0) {
              lVar8 = uVar11 - local_238;
              args = (char *)operator_new__(lVar8 + 2);
              if (s._M_dataplus._M_p + ((uVar11 + 1) - (long)(s._M_dataplus._M_p + local_238)) !=
                  (pointer)0x0) {
                memmove(args,s._M_dataplus._M_p + local_238,
                        (size_t)(s._M_dataplus._M_p +
                                ((uVar11 + 1) - (long)(s._M_dataplus._M_p + local_238))));
              }
              args[lVar8 + 1] = '\0';
              this_01 = (LazyObject *)operator_new(0x28);
              this_00 = local_230;
              LazyObject::LazyObject(this_01,local_230,id,sVar15,pcVar14,args);
              DB::InternInsert(this_00,this_01);
            }
            if (local_271 == '\0') {
              LineSplitter::operator++(local_270);
            }
            std::__cxx11::string::~string((string *)&type);
            db = local_230;
          }
        }
      }
    }
    else {
      pLVar13 = DefaultLogger::get();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"expected token \'#\'",(allocator<char> *)&local_1c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"",(allocator<char> *)&id);
      AddLineNumber(&type,&local_258,local_268,&local_228);
      Logger::warn(pLVar13,(char *)CONCAT71(type._M_dataplus._M_p._1_7_,type._M_dataplus._M_p._0_1_)
                  );
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_258);
      LineSplitter::operator++(local_270);
    }
    std::__cxx11::string::~string((string *)&s);
  } while( true );
}

Assistant:

void STEP::ReadFile(DB& db,const EXPRESS::ConversionSchema& scheme,
    const char* const* types_to_track, size_t len,
    const char* const* inverse_indices_to_track, size_t len2)
{
    db.SetSchema(scheme);
    db.SetTypesToTrack(types_to_track,len);
    db.SetInverseIndicesToTrack(inverse_indices_to_track,len2);

    const DB::ObjectMap& map = db.GetObjects();
    LineSplitter& splitter = db.GetSplitter();

    while (splitter) {
        bool has_next = false;
        std::string s = *splitter;
        if (s == "ENDSEC;") {
            break;
        }
        s.erase(std::remove(s.begin(), s.end(), ' '), s.end());

        // want one-based line numbers for human readers, so +1
        const uint64_t line = splitter.get_index()+1;
        // LineSplitter already ignores empty lines
        ai_assert(s.length());
        if (s[0] != '#') {
            ASSIMP_LOG_WARN(AddLineNumber("expected token \'#\'",line));
            ++splitter;
            continue;
        }
        // ---
        // extract id, entity class name and argument string,
        // but don't create the actual object yet.
        // ---
        const std::string::size_type n0 = s.find_first_of('=');
        if (n0 == std::string::npos) {
            ASSIMP_LOG_WARN(AddLineNumber("expected token \'=\'",line));
            ++splitter;
            continue;
        }

        const uint64_t id = strtoul10_64(s.substr(1,n0-1).c_str());
        if (!id) {
            ASSIMP_LOG_WARN(AddLineNumber("expected positive, numeric entity id",line));
            ++splitter;
            continue;
        }
        std::string::size_type n1 = s.find_first_of('(',n0);
        if (n1 == std::string::npos) {
            has_next = true;
            bool ok = false;
            for( ++splitter; splitter; ++splitter) {
                const std::string& snext = *splitter;
                if (snext.empty()) {
                    continue;
                }

                // the next line doesn't start an entity, so maybe it is
                // just a continuation  for this line, keep going
                if (!IsEntityDef(snext)) {
                    s.append(snext);
                    n1 = s.find_first_of('(',n0);
                    ok = (n1 != std::string::npos);
                }
                else {
                    break;
                }
            }

            if(!ok) {
                ASSIMP_LOG_WARN(AddLineNumber("expected token \'(\'",line));
                continue;
            }
        }

        std::string::size_type n2 = s.find_last_of(')');
        if (n2 == std::string::npos || n2 < n1 || n2 == s.length() - 1 || s[n2 + 1] != ';') {
            has_next = true;
            bool ok = false;
            for( ++splitter; splitter; ++splitter) {
                const std::string& snext = *splitter;
                if (snext.empty()) {
                    continue;
                }

                // the next line doesn't start an entity, so maybe it is
                // just a continuation  for this line, keep going
                if (!IsEntityDef(snext)) {
                    s.append(snext);
                    n2 = s.find_last_of(')');
                    ok = !(n2 == std::string::npos || n2 < n1 || n2 == s.length() - 1 || s[n2 + 1] != ';');
                } else {
                    break;
                }
            }
            if(!ok) {
                ASSIMP_LOG_WARN(AddLineNumber("expected token \')\'",line));
                continue;
            }
        }

        if (map.find(id) != map.end()) {
            ASSIMP_LOG_WARN(AddLineNumber((Formatter::format(),"an object with the id #",id," already exists"),line));
        }

        std::string::size_type ns = n0;
        do ++ns; while( IsSpace(s.at(ns)));
        std::string::size_type ne = n1;
        do --ne; while( IsSpace(s.at(ne)));
        std::string type = s.substr(ns,ne-ns+1);
        std::transform( type.begin(), type.end(), type.begin(), &Assimp::ToLower<char>  );
        const char* sz = scheme.GetStaticStringForToken(type);
        if(sz) {
            const std::string::size_type szLen = n2-n1+1;
            char* const copysz = new char[szLen+1];
            std::copy(s.c_str()+n1,s.c_str()+n2+1,copysz);
            copysz[szLen] = '\0';
            db.InternInsert(new LazyObject(db,id,line,sz,copysz));
        }
        if(!has_next) {
            ++splitter;
        }
    }

    if (!splitter) {
        ASSIMP_LOG_WARN("STEP: ignoring unexpected EOF");
    }

    if ( !DefaultLogger::isNullLogger()){
        ASSIMP_LOG_DEBUG((Formatter::format(),"STEP: got ",map.size()," object records with ",
            db.GetRefs().size()," inverse index entries"));
    }
}